

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZmqComms.cpp
# Opt level: O0

void __thiscall helics::zeromq::ZmqComms::~ZmqComms(ZmqComms *this)

{
  ZmqComms *in_RDI;
  
  ~ZmqComms(in_RDI);
  operator_delete(in_RDI,0x4c0);
  return;
}

Assistant:

ZmqComms::~ZmqComms()
{
    disconnect();
}